

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcf.c
# Opt level: O0

int bcf_update_filter(bcf_hdr_t *hdr,bcf1_t *line,int *flt_ids,int n)

{
  int *piVar1;
  int local_30;
  int i;
  int n_local;
  int *flt_ids_local;
  bcf1_t *line_local;
  bcf_hdr_t *hdr_local;
  
  if ((line->unpacked & 2U) == 0) {
    bcf_unpack(line,2);
  }
  (line->d).shared_dirty = (line->d).shared_dirty | 4;
  (line->d).n_flt = n;
  if (n != 0) {
    if ((line->d).m_flt < (line->d).n_flt) {
      (line->d).m_flt = (line->d).n_flt;
      (line->d).m_flt = (line->d).m_flt + -1;
      (line->d).m_flt = (line->d).m_flt >> 1 | (line->d).m_flt;
      (line->d).m_flt = (line->d).m_flt >> 2 | (line->d).m_flt;
      (line->d).m_flt = (line->d).m_flt >> 4 | (line->d).m_flt;
      (line->d).m_flt = (line->d).m_flt >> 8 | (line->d).m_flt;
      (line->d).m_flt = (line->d).m_flt >> 0x10 | (line->d).m_flt;
      (line->d).m_flt = (line->d).m_flt + 1;
      piVar1 = (int *)realloc((line->d).flt,(long)(line->d).m_flt << 2);
      (line->d).flt = piVar1;
    }
    for (local_30 = 0; local_30 < n; local_30 = local_30 + 1) {
      (line->d).flt[local_30] = flt_ids[local_30];
    }
  }
  return 0;
}

Assistant:

int bcf_update_filter(const bcf_hdr_t *hdr, bcf1_t *line, int *flt_ids, int n)
{
    if ( !(line->unpacked & BCF_UN_FLT) ) bcf_unpack(line, BCF_UN_FLT);
    line->d.shared_dirty |= BCF1_DIRTY_FLT;
    line->d.n_flt = n;
    if ( !n ) return 0;
    hts_expand(int, line->d.n_flt, line->d.m_flt, line->d.flt);
    int i;
    for (i=0; i<n; i++)
        line->d.flt[i] = flt_ids[i];
    return 0;
}